

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3Appendf(int *pRc,char **pz,char *zFormat,...)

{
  char in_AL;
  char *p;
  char *pcVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 auStack_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined4 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  __va_list_tag local_48;
  long local_28;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Da;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  if (*pRc == 0) {
    local_48.gp_offset = 0x18;
    local_48.fp_offset = 0x30;
    local_48.overflow_arg_area = &stack0x00000008;
    local_48.reg_save_area = auStack_f8;
    p = sqlite3_vmprintf(zFormat,&local_48);
    if (p == (char *)0x0) {
      pcVar1 = (char *)0x0;
    }
    else {
      pcVar1 = p;
      if (*pz != (char *)0x0) {
        pcVar1 = sqlite3_mprintf("%s%s",*pz,p);
        sqlite3_free(p);
      }
    }
    if (pcVar1 == (char *)0x0) {
      *pRc = 7;
    }
    sqlite3_free(*pz);
    *pz = pcVar1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts3Appendf(
  int *pRc,                       /* IN/OUT: Error code */
  char **pz,                      /* IN/OUT: Pointer to string buffer */
  const char *zFormat,            /* Printf format string to append */
  ...                             /* Arguments for printf format string */
){
  if( *pRc==SQLITE_OK ){
    va_list ap;
    char *z;
    va_start(ap, zFormat);
    z = sqlite3_vmprintf(zFormat, ap);
    va_end(ap);
    if( z && *pz ){
      char *z2 = sqlite3_mprintf("%s%s", *pz, z);
      sqlite3_free(z);
      z = z2;
    }
    if( z==0 ) *pRc = SQLITE_NOMEM;
    sqlite3_free(*pz);
    *pz = z;
  }
}